

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.h
# Opt level: O0

void __thiscall
rapidjson::
GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::Parse(GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
        *this,Ch *source,size_t length)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  CrtAllocator *pCVar4;
  Ch *begin_00;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  bool bVar8;
  uint local_c0;
  byte local_ba;
  ulong uStack_a8;
  SizeType m;
  size_t j;
  SizeType n;
  size_t len;
  Ch *begin;
  GenericInsituStringStream<rapidjson::UTF8<char>_> os;
  PercentDecodeStream is;
  Ch c;
  bool isNumber;
  ulong uStack_40;
  bool uriFragment;
  size_t i;
  Ch *name;
  Token *token;
  Ch *s;
  size_t length_local;
  Ch *source_local;
  GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  *this_local;
  
  if (source == (Ch *)0x0) {
    __assert_fail("source != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/pointer.h"
                  ,0x3a3,
                  "void rapidjson::GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<>>>::Parse(const Ch *, size_t) [ValueType = rapidjson::GenericValue<rapidjson::UTF8<>>, Allocator = rapidjson::CrtAllocator]"
                 );
  }
  if (this->nameBuffer_ != (Ch *)0x0) {
    __assert_fail("nameBuffer_ == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/pointer.h"
                  ,0x3a4,
                  "void rapidjson::GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<>>>::Parse(const Ch *, size_t) [ValueType = rapidjson::GenericValue<rapidjson::UTF8<>>, Allocator = rapidjson::CrtAllocator]"
                 );
  }
  if (this->tokens_ != (Token *)0x0) {
    __assert_fail("tokens_ == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/pointer.h"
                  ,0x3a5,
                  "void rapidjson::GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<>>>::Parse(const Ch *, size_t) [ValueType = rapidjson::GenericValue<rapidjson::UTF8<>>, Allocator = rapidjson::CrtAllocator]"
                 );
  }
  if (this->allocator_ == (CrtAllocator *)0x0) {
    pCVar4 = (CrtAllocator *)operator_new(1);
    this->allocator_ = pCVar4;
    this->ownAllocator_ = pCVar4;
  }
  this->tokenCount_ = 0;
  for (token = (Token *)source; token != (Token *)(source + length);
      token = (Token *)((long)&token->name + 1)) {
    if (*(char *)&token->name == '/') {
      this->tokenCount_ = this->tokenCount_ + 1;
    }
  }
  name = (Ch *)CrtAllocator::Malloc(this->allocator_,this->tokenCount_ * 0x10 + length);
  this->tokens_ = (Token *)name;
  i = (size_t)(this->tokens_ + this->tokenCount_);
  this->nameBuffer_ = (Ch *)i;
  cVar1 = *source;
  uStack_40 = (ulong)(cVar1 == '#');
  if ((uStack_40 == length) || (source[uStack_40] == '/')) {
    while (uStack_40 < length) {
      if (source[uStack_40] != '/') {
        __assert_fail("source[i] == \'/\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/pointer.h"
                      ,0x3c2,
                      "void rapidjson::GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<>>>::Parse(const Ch *, size_t) [ValueType = rapidjson::GenericValue<rapidjson::UTF8<>>, Allocator = rapidjson::CrtAllocator]"
                     );
      }
      uStack_40 = uStack_40 + 1;
      *(size_t *)name = i;
      bVar2 = true;
      while( true ) {
        bVar8 = false;
        if (uStack_40 < length) {
          bVar8 = source[uStack_40] != '/';
        }
        if (!bVar8) break;
        is._29_1_ = source[uStack_40];
        if (cVar1 == '#') {
          if (is._29_1_ != '%') {
            bVar8 = NeedPercentEncode(this,is._29_1_);
            if (!bVar8) goto LAB_00177467;
            this->parseErrorCode_ = kPointerParseErrorCharacterMustPercentEncode;
            goto LAB_00177683;
          }
          PercentDecodeStream::PercentDecodeStream
                    ((PercentDecodeStream *)&os.head_,source + uStack_40,source + length);
          GenericInsituStringStream<rapidjson::UTF8<char>_>::GenericInsituStringStream
                    ((GenericInsituStringStream<rapidjson::UTF8<char>_> *)&begin,(Ch *)i);
          begin_00 = GenericInsituStringStream<rapidjson::UTF8<char>_>::PutBegin
                               ((GenericInsituStringStream<rapidjson::UTF8<char>_> *)&begin);
          bVar8 = Transcoder<rapidjson::UTF8<char>,rapidjson::UTF8<char>>::
                  Validate<rapidjson::GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>::PercentDecodeStream,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
                            ((PercentDecodeStream *)&os.head_,
                             (GenericInsituStringStream<rapidjson::UTF8<char>_> *)&begin);
          local_ba = 1;
          if (bVar8) {
            bVar8 = PercentDecodeStream::IsValid((PercentDecodeStream *)&os.head_);
            local_ba = bVar8 ^ 0xff;
          }
          if ((local_ba & 1) != 0) {
            this->parseErrorCode_ = kPointerParseErrorInvalidPercentEncoding;
            goto LAB_00177683;
          }
          sVar5 = GenericInsituStringStream<rapidjson::UTF8<char>_>::PutEnd
                            ((GenericInsituStringStream<rapidjson::UTF8<char>_> *)&begin,begin_00);
          sVar6 = PercentDecodeStream::Tell((PercentDecodeStream *)&os.head_);
          uStack_40 = (sVar6 - 1) + uStack_40;
          if (sVar5 == 1) {
            is._29_1_ = *(undefined1 *)i;
            goto LAB_00177467;
          }
          i = sVar5 + i;
          bVar2 = false;
          uStack_40 = uStack_40 + 1;
        }
        else {
LAB_00177467:
          uVar7 = uStack_40 + 1;
          if (is._29_1_ == '~') {
            if (length <= uVar7) {
              this->parseErrorCode_ = kPointerParseErrorInvalidEscape;
              uStack_40 = uVar7;
              goto LAB_00177683;
            }
            if (source[uVar7] == '0') {
              is._29_1_ = 0x7e;
            }
            else {
              if (source[uVar7] != '1') {
                this->parseErrorCode_ = kPointerParseErrorInvalidEscape;
                uStack_40 = uVar7;
                goto LAB_00177683;
              }
              is._29_1_ = 0x2f;
            }
            uVar7 = uStack_40 + 2;
          }
          uStack_40 = uVar7;
          if (((char)is._29_1_ < '0') || ('9' < (char)is._29_1_)) {
            bVar2 = false;
          }
          *(undefined1 *)i = is._29_1_;
          i = i + 1;
        }
      }
      *(int *)(name + 8) = (int)i - (int)*(undefined8 *)name;
      if (*(int *)(name + 8) == 0) {
        bVar2 = false;
      }
      *(undefined1 *)i = 0;
      if (((bVar2) && (1 < *(uint *)(name + 8))) && (**(char **)name == '0')) {
        bVar2 = false;
      }
      j._4_4_ = 0;
      if (bVar2) {
        for (uStack_a8 = 0; uStack_a8 < *(uint *)(name + 8); uStack_a8 = uStack_a8 + 1) {
          uVar3 = j._4_4_ * 10 + *(char *)(*(long *)name + uStack_a8) + -0x30;
          if (uVar3 < j._4_4_) {
            bVar2 = false;
            break;
          }
          j._4_4_ = uVar3;
        }
      }
      if (bVar2) {
        local_c0 = j._4_4_;
      }
      else {
        local_c0 = 0xffffffff;
      }
      *(uint *)(name + 0xc) = local_c0;
      name = name + 0x10;
      i = i + 1;
    }
    if (this->nameBuffer_ + length < i) {
      __assert_fail("name <= nameBuffer_ + length",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/pointer.h"
                    ,0x419,
                    "void rapidjson::GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<>>>::Parse(const Ch *, size_t) [ValueType = rapidjson::GenericValue<rapidjson::UTF8<>>, Allocator = rapidjson::CrtAllocator]"
                   );
    }
    this->parseErrorCode_ = kPointerParseErrorNone;
  }
  else {
    this->parseErrorCode_ = kPointerParseErrorTokenMustBeginWithSolidus;
LAB_00177683:
    CrtAllocator::Free(this->tokens_);
    this->nameBuffer_ = (Ch *)0x0;
    this->tokens_ = (Token *)0x0;
    this->tokenCount_ = 0;
    this->parseErrorOffset_ = uStack_40;
  }
  return;
}

Assistant:

void Parse(const Ch* source, size_t length) {
        RAPIDJSON_ASSERT(source != NULL);
        RAPIDJSON_ASSERT(nameBuffer_ == 0);
        RAPIDJSON_ASSERT(tokens_ == 0);

        // Create own allocator if user did not supply.
        if (!allocator_)
            ownAllocator_ = allocator_ = RAPIDJSON_NEW(Allocator)();

        // Count number of '/' as tokenCount
        tokenCount_ = 0;
        for (const Ch* s = source; s != source + length; s++) 
            if (*s == '/')
                tokenCount_++;

        Token* token = tokens_ = static_cast<Token *>(allocator_->Malloc(tokenCount_ * sizeof(Token) + length * sizeof(Ch)));
        Ch* name = nameBuffer_ = reinterpret_cast<Ch *>(tokens_ + tokenCount_);
        size_t i = 0;

        // Detect if it is a URI fragment
        bool uriFragment = false;
        if (source[i] == '#') {
            uriFragment = true;
            i++;
        }

        if (i != length && source[i] != '/') {
            parseErrorCode_ = kPointerParseErrorTokenMustBeginWithSolidus;
            goto error;
        }

        while (i < length) {
            RAPIDJSON_ASSERT(source[i] == '/');
            i++; // consumes '/'

            token->name = name;
            bool isNumber = true;

            while (i < length && source[i] != '/') {
                Ch c = source[i];
                if (uriFragment) {
                    // Decoding percent-encoding for URI fragment
                    if (c == '%') {
                        PercentDecodeStream is(&source[i], source + length);
                        GenericInsituStringStream<EncodingType> os(name);
                        Ch* begin = os.PutBegin();
                        if (!Transcoder<UTF8<>, EncodingType>().Validate(is, os) || !is.IsValid()) {
                            parseErrorCode_ = kPointerParseErrorInvalidPercentEncoding;
                            goto error;
                        }
                        size_t len = os.PutEnd(begin);
                        i += is.Tell() - 1;
                        if (len == 1)
                            c = *name;
                        else {
                            name += len;
                            isNumber = false;
                            i++;
                            continue;
                        }
                    }
                    else if (NeedPercentEncode(c)) {
                        parseErrorCode_ = kPointerParseErrorCharacterMustPercentEncode;
                        goto error;
                    }
                }

                i++;

                // Escaping "~0" -> '~', "~1" -> '/'
                if (c == '~') {
                    if (i < length) {
                        c = source[i];
                        if (c == '0')       c = '~';
                        else if (c == '1')  c = '/';
                        else {
                            parseErrorCode_ = kPointerParseErrorInvalidEscape;
                            goto error;
                        }
                        i++;
                    }
                    else {
                        parseErrorCode_ = kPointerParseErrorInvalidEscape;
                        goto error;
                    }
                }

                // First check for index: all of characters are digit
                if (c < '0' || c > '9')
                    isNumber = false;

                *name++ = c;
            }
            token->length = static_cast<SizeType>(name - token->name);
            if (token->length == 0)
                isNumber = false;
            *name++ = '\0'; // Null terminator

            // Second check for index: more than one digit cannot have leading zero
            if (isNumber && token->length > 1 && token->name[0] == '0')
                isNumber = false;

            // String to SizeType conversion
            SizeType n = 0;
            if (isNumber) {
                for (size_t j = 0; j < token->length; j++) {
                    SizeType m = n * 10 + static_cast<SizeType>(token->name[j] - '0');
                    if (m < n) {   // overflow detection
                        isNumber = false;
                        break;
                    }
                    n = m;
                }
            }

            token->index = isNumber ? n : kPointerInvalidIndex;
            token++;
        }

        RAPIDJSON_ASSERT(name <= nameBuffer_ + length); // Should not overflow buffer
        parseErrorCode_ = kPointerParseErrorNone;
        return;

    error:
        Allocator::Free(tokens_);
        nameBuffer_ = 0;
        tokens_ = 0;
        tokenCount_ = 0;
        parseErrorOffset_ = i;
        return;
    }